

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

uint32_t LogLuv32fromXYZ(float *XYZ,int em)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  iVar1 = LogL16fromY((double)XYZ[1],em);
  dVar6 = (double)XYZ[2] * 3.0 + (double)XYZ[1] * 15.0 + (double)*XYZ;
  if (dVar6 <= 0.0 || iVar1 == 0) {
    dVar5 = 0.210526316;
    dVar6 = 0.473684211;
  }
  else {
    dVar5 = ((double)*XYZ * 4.0) / dVar6;
    dVar6 = ((double)XYZ[1] * 9.0) / dVar6;
  }
  uVar3 = 0;
  uVar2 = 0;
  if (0.0 < dVar5) {
    uVar2 = tiff_itrunc(dVar5 * 410.0,em);
  }
  if (0.0 < dVar6) {
    uVar3 = tiff_itrunc(dVar6 * 410.0,em);
  }
  if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  uVar4 = 0xff;
  if (uVar3 < 0xff) {
    uVar4 = uVar3;
  }
  return uVar2 << 8 | uVar4 | iVar1 << 0x10;
}

Assistant:

uint32_t
    LogLuv32fromXYZ(float *XYZ, int em)
{
    unsigned int Le, ue, ve;
    double u, v, s;
    /* encode luminance */
    Le = (unsigned int)LogL16fromY(XYZ[1], em);
    /* encode color */
    s = XYZ[0] + 15. * XYZ[1] + 3. * XYZ[2];
    if (!Le || s <= 0.)
    {
        u = U_NEU;
        v = V_NEU;
    }
    else
    {
        u = 4. * XYZ[0] / s;
        v = 9. * XYZ[1] / s;
    }
    if (u <= 0.)
        ue = 0;
    else
        ue = tiff_itrunc(UVSCALE * u, em);
    if (ue > 255)
        ue = 255;
    if (v <= 0.)
        ve = 0;
    else
        ve = tiff_itrunc(UVSCALE * v, em);
    if (ve > 255)
        ve = 255;
    /* combine encodings */
    return (Le << 16 | ue << 8 | ve);
}